

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::GenUnpackVal
          (string *__return_storage_ptr__,CppGenerator *this,Type *type,string *val,bool invector,
          FieldDef *afield)

{
  BaseType BVar1;
  StructDef *pSVar2;
  bool bVar3;
  Value *pVVar4;
  SymbolTable<flatbuffers::Value> *this_00;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *this_02;
  string name;
  string ptype;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Value *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  BVar1 = type->base_type;
  if (BVar1 == BASE_TYPE_UNION) {
    pcVar5 = "->Get(_i)";
    if (invector) {
      std::operator+(&ptype,"->GetEnum<",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     type->enum_def);
      std::operator+(&name,&ptype,">(_i)");
    }
    else {
      pcVar5 = "";
      name._M_dataplus._M_p = "";
    }
    GenUnionUnpackVal_abi_cxx11_(__return_storage_ptr__,this,afield,pcVar5,name._M_dataplus._M_p);
    if (!invector) {
      return __return_storage_ptr__;
    }
LAB_001701e5:
    std::__cxx11::string::~string((string *)&name);
    this_02 = &ptype;
  }
  else {
    if (BVar1 != BASE_TYPE_STRUCT) {
      if (BVar1 != BASE_TYPE_STRING) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)val);
        return __return_storage_ptr__;
      }
      bVar3 = FlexibleStringConstructor(this,afield);
      if (!bVar3) {
        std::operator+(__return_storage_ptr__,val,"->str()");
        return __return_storage_ptr__;
      }
      NativeString_abi_cxx11_(&local_70,this,afield);
      std::operator+(&local_90,&local_70,"(");
      std::operator+(&local_b8,&local_90,val);
      std::operator+(&ptype,&local_b8,"->c_str(), ");
      std::operator+(&name,&ptype,val);
      std::operator+(__return_storage_ptr__,&name,"->size())");
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&ptype);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_90);
      this_02 = &local_70;
      goto LAB_001702e9;
    }
    pSVar2 = type->struct_def;
    if (pSVar2->fixed == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"native_type",(allocator<char> *)&ptype);
      this_00 = &(pSVar2->super_Definition).attributes;
      local_98 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&name);
      std::__cxx11::string::~string((string *)&name);
      if (local_98 != (Value *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"::flatbuffers::UnPack",(allocator<char> *)&name
                  );
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&name,"native_type_pack_name",(allocator<char> *)&ptype);
        pVVar4 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&name);
        std::__cxx11::string::~string((string *)&name);
        if (pVVar4 != (Value *)0x0) {
          std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        std::operator+(&ptype,"(*",val);
        std::operator+(&name,&ptype,")");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        goto LAB_001701e5;
      }
      if ((invector) || (afield->native_inline == true)) {
        std::operator+(__return_storage_ptr__,"*",val);
        return __return_storage_ptr__;
      }
      pSVar2 = type->struct_def;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ptype,"",(allocator<char> *)&local_b8);
      BaseGenerator::WrapInNameSpace
                (&name,&this->super_BaseGenerator,&pSVar2->super_Definition,&ptype);
      std::__cxx11::string::~string((string *)&ptype);
      GenTypeNativePtr(&ptype,this,&name,afield,true);
      std::operator+(&local_50,&ptype,"(new ");
      std::operator+(&local_70,&local_50,&name);
      std::operator+(&local_90,&local_70,"(*");
      std::operator+(&local_b8,&local_90,val);
      std::operator+(__return_storage_ptr__,&local_b8,"))");
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      this_01 = &ptype;
    }
    else {
      pcVar5 = "";
      if (afield->native_inline != false) {
        pcVar5 = "*";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,pcVar5,(allocator<char> *)&ptype);
      WrapNativeNameInNameSpace_abi_cxx11_
                (&local_b8,this,type->struct_def,&(this->opts_).super_IDLOptions);
      GenTypeNativePtr(&ptype,this,&local_b8,afield,true);
      std::__cxx11::string::append((string *)&name);
      std::__cxx11::string::~string((string *)&ptype);
      std::__cxx11::string::~string((string *)&local_b8);
      std::operator+(&local_b8,&name,"(");
      std::operator+(&ptype,&local_b8,val);
      std::operator+(__return_storage_ptr__,&ptype,"->UnPack(_resolver))");
      std::__cxx11::string::~string((string *)&ptype);
      this_01 = &local_b8;
    }
    std::__cxx11::string::~string((string *)this_01);
    this_02 = &name;
  }
LAB_001702e9:
  std::__cxx11::string::~string((string *)this_02);
  return __return_storage_ptr__;
}

Assistant:

std::string GenUnpackVal(const Type &type, const std::string &val,
                           bool invector, const FieldDef &afield) {
    switch (type.base_type) {
      case BASE_TYPE_STRING: {
        if (FlexibleStringConstructor(&afield)) {
          return NativeString(&afield) + "(" + val + "->c_str(), " + val +
                 "->size())";
        } else {
          return val + "->str()";
        }
      }
      case BASE_TYPE_STRUCT: {
        if (IsStruct(type)) {
          const auto &struct_attrs = type.struct_def->attributes;
          const auto native_type = struct_attrs.Lookup("native_type");
          if (native_type) {
            std::string unpack_call = "::flatbuffers::UnPack";
            const auto pack_name = struct_attrs.Lookup("native_type_pack_name");
            if (pack_name) { unpack_call += pack_name->constant; }
            unpack_call += "(*" + val + ")";
            return unpack_call;
          } else if (invector || afield.native_inline) {
            return "*" + val;
          } else {
            const auto name = WrapInNameSpace(*type.struct_def);
            const auto ptype = GenTypeNativePtr(name, &afield, true);
            return ptype + "(new " + name + "(*" + val + "))";
          }
        } else {
          std::string ptype = afield.native_inline ? "*" : "";
          ptype += GenTypeNativePtr(
              WrapNativeNameInNameSpace(*type.struct_def, opts_), &afield,
              true);
          return ptype + "(" + val + "->UnPack(_resolver))";
        }
      }
      case BASE_TYPE_UNION: {
        return GenUnionUnpackVal(
            afield, invector ? "->Get(_i)" : "",
            invector ? ("->GetEnum<" + type.enum_def->name + ">(_i)").c_str()
                     : "");
      }
      default: {
        return val;
        break;
      }
    }
  }